

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O3

vec3 __thiscall polyscope::SlicePlane::getNormal(SlicePlane *this)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  float fVar5;
  vec3 vVar6;
  vec3 vVar7;
  
  if ((this->active).value == true) {
    uVar2 = (this->objectTransform).value.value[0].field_0;
    uVar3 = (this->objectTransform).value.value[0].field_1;
    fVar1 = (this->objectTransform).value.value[0].field_2.z;
    auVar4._0_4_ = (float)uVar2 * (float)uVar2;
    auVar4._4_4_ = (float)uVar3 * (float)uVar3;
    auVar4._8_8_ = 0;
    auVar4 = vhaddps_avx(auVar4,auVar4);
    auVar4 = ZEXT416((uint)(auVar4._0_4_ + fVar1 * fVar1));
    auVar4 = vsqrtss_avx(auVar4,auVar4);
    fVar5 = 1.0 / auVar4._0_4_;
    vVar6.field_0 = (float)uVar2 * fVar5;
    vVar6.field_1 = (float)uVar3 * fVar5;
    vVar6.field_2.z = fVar1 * fVar5;
    return vVar6;
  }
  vVar7._0_8_ = SUB648(ZEXT464(0xbf800000),0);
  vVar7.field_2.z = 0.0;
  return vVar7;
}

Assistant:

glm::vec3 SlicePlane::getNormal() {
  if (active.get()) {
    glm::vec3 normal{objectTransform.get()[0][0], objectTransform.get()[0][1], objectTransform.get()[0][2]};
    normal = glm::normalize(normal);
    return normal;
  } else {
    // Matched with center so tests always pass when disabled
    return glm::vec3{-1., 0., 0.};
  }
}